

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

void list(archive *a,archive_entry *e)

{
  int iVar1;
  tm *__tp;
  la_int64_t lVar2;
  la_int64_t lVar3;
  char *pcVar4;
  char *pcStack_50;
  int acret;
  char *pathname;
  tm *tm;
  time_t mtime;
  char buf [20];
  archive_entry *e_local;
  archive *a_local;
  
  tm = (tm *)archive_entry_mtime(e);
  __tp = localtime((time_t *)&tm);
  if (*y_str == '\0') {
    strftime((char *)&mtime,0x14,"%m-%d-%g %R",__tp);
  }
  else {
    strftime((char *)&mtime,0x14,"%m-%d-%G %R",__tp);
  }
  pcStack_50 = archive_entry_pathname(e);
  if (pcStack_50 == (char *)0x0) {
    pcStack_50 = "";
  }
  if (zipinfo_mode == 0) {
    if (v_opt == 1) {
      lVar2 = archive_entry_size(e);
      printf(" %8ju  %s   %s\n",lVar2,&mtime,pcStack_50);
    }
    else if (v_opt == 2) {
      lVar2 = archive_entry_size(e);
      lVar3 = archive_entry_size(e);
      printf("%8ju  Stored  %7ju   0%%  %s  %08x  %s\n",lVar2,lVar3,&mtime,0,pcStack_50);
    }
  }
  else if (Z1_opt != 0) {
    printf("%s\n",pcStack_50);
  }
  iVar1 = archive_read_data_skip(a);
  if (iVar1 != 0) {
    pcVar4 = archive_error_string(a);
    errorx("%s",pcVar4);
  }
  return;
}

Assistant:

static void
list(struct archive *a, struct archive_entry *e)
{
	char buf[20];
	time_t mtime;
	struct tm *tm;
	const char *pathname;

	mtime = archive_entry_mtime(e);
	tm = localtime(&mtime);
	if (*y_str)
		strftime(buf, sizeof(buf), "%m-%d-%G %R", tm);
	else
		strftime(buf, sizeof(buf), "%m-%d-%g %R", tm);

	pathname = archive_entry_pathname(e);
	if (!pathname)
		pathname = "";
	if (!zipinfo_mode) {
		if (v_opt == 1) {
			printf(" %8ju  %s   %s\n",
			    (uintmax_t)archive_entry_size(e),
			    buf, pathname);
		} else if (v_opt == 2) {
			printf("%8ju  Stored  %7ju   0%%  %s  %08x  %s\n",
			    (uintmax_t)archive_entry_size(e),
			    (uintmax_t)archive_entry_size(e),
			    buf,
			    0U,
			    pathname);
		}
	} else {
		if (Z1_opt)
			printf("%s\n", pathname);
	}
	ac(archive_read_data_skip(a));
}